

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void hash_table_create(hash_table_t *table,uint initial_size,_func_int_void_ptr_void_ptr *is_equal,
                      _func_size_t_void_ptr *hash)

{
  int iVar1;
  hash_table_bucket_t *phVar2;
  hash_table_bucket_t *phVar3;
  uint buckets;
  ulong uVar4;
  uint x;
  bool bVar5;
  universal_hash_function_t local_40;
  
  if (initial_size < 3) {
    initial_size = 2;
  }
  table->n_items = 0;
  x = initial_size - 1;
  iVar1 = uint32_log2(x);
  buckets = 2 << ((byte)iVar1 & 0x1f);
  table->n_buckets = buckets;
  phVar2 = (hash_table_bucket_t *)calloc((ulong)(uint)(4 << ((byte)iVar1 & 0x1f)),0x10);
  table->allocs = phVar2;
  if (phVar2 != (hash_table_bucket_t *)0x0) {
    table->buckets = phVar2 + 1;
    table->free_buckets = phVar2 + (ulong)buckets + 1;
    phVar3 = phVar2 + (ulong)buckets + 2;
    uVar4 = (ulong)x;
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      phVar3[-1].next = phVar3;
      phVar3 = phVar3 + 1;
    }
    phVar2[(ulong)buckets + (ulong)x + 1].next = (hash_table_bucket_t *)0x0;
    table->is_equal = is_equal;
    table->hash = hash;
    table->seed = 0;
    new_universal_hash_function(&local_40,&table->seed,buckets);
    (table->ghash).log2_buckets = local_40.log2_buckets;
    *(undefined4 *)&(table->ghash).field_0x14 = local_40._20_4_;
    (table->ghash).mult = local_40.mult;
    (table->ghash).add = local_40.add;
    table->max_load = 1.0;
    table->max_collisions = 5;
    return;
  }
  fwrite("hash_table_create: Insufficient memory\n",0x27,1,_stderr);
  abort();
}

Assistant:

void hash_table_create( hash_table_t * table, unsigned initial_size,
       int (*is_equal)(const void * a, const void * b),
       size_t (*hash)(const void * x) ) 
{
    unsigned i;
    if (initial_size < 2 ) initial_size = 2;

    table->n_items = 0;
    table->n_buckets = 1u << (int_log2( initial_size-1) + 1 );
    table->allocs  
        = calloc( 2*table->n_buckets, sizeof(hash_table_bucket_t));
    if ( table->allocs == NULL) {
        fprintf( stderr, "hash_table_create: Insufficient memory\n");
        abort();
    }

    table->buckets = table->allocs + 1;
    table->free_buckets  = table->allocs + table->n_buckets + 1;
    
    /* initialize free list */
    for ( i = 0; i < initial_size - 1; ++i )
        table->free_buckets[i].next = &table->free_buckets[i+1];
    table->free_buckets[initial_size-1].next = NULL;

    table->is_equal = is_equal;
    table->hash = hash;
    table->seed = 0;
    table->ghash 
        = new_universal_hash_function( &table->seed, table->n_buckets );

    /* some configurable constants */
    table->max_load = 1.0;
    table->max_collisions = 5;
}